

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O3

void drop_nonterminal_imp_node
               (vector<ImputeNode,_std::allocator<ImputeNode>_> *imputer_tree,
               vector<IsoTree,_std::allocator<IsoTree>_> *trees,
               vector<IsoHPlane,_std::allocator<IsoHPlane>_> *hplanes)

{
  vector<double,_std::allocator<double>_> *pvVar1;
  pointer pIVar2;
  pointer pdVar3;
  pointer pIVar4;
  pointer pIVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  
  if (trees == (vector<IsoTree,_std::allocator<IsoTree>_> *)0x0) {
    pIVar5 = (hplanes->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((hplanes->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
        super__Vector_impl_data._M_finish != pIVar5) {
      lVar8 = 0x48;
      lVar6 = 200;
      uVar7 = 0;
      do {
        pIVar2 = (imputer_tree->super__Vector_base<ImputeNode,_std::allocator<ImputeNode>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        if (*(long *)((long)&(pIVar5->col_num).
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar6) == 0) {
          pvVar1 = (vector<double,_std::allocator<double>_> *)
                   ((long)&(pIVar2->num_sum).super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl + lVar8);
          pdVar3 = *(pointer *)
                    ((long)&(pIVar2->num_sum).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl + lVar8);
          if (*(pointer *)
               ((long)&(pIVar2->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl
               + lVar8 + 8) != pdVar3) {
            (pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish = pdVar3;
          }
          if (*(pointer *)
               ((long)&(pIVar2->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl
               + lVar8 + 0x10) != pdVar3) {
            std::__shrink_to_fit_aux<std::vector<double,_std::allocator<double>_>,_true>::_S_do_it
                      (pvVar1);
          }
        }
        else {
          shrink_impute_node((ImputeNode *)((long)pIVar2 + lVar8 + -0x48));
        }
        uVar7 = uVar7 + 1;
        pIVar5 = (hplanes->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar8 = lVar8 + 0x68;
        lVar6 = lVar6 + 0xf8;
      } while (uVar7 < (ulong)(((long)(hplanes->
                                      super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>).
                                      _M_impl.super__Vector_impl_data._M_finish - (long)pIVar5 >> 3)
                              * -0x1084210842108421));
    }
  }
  else {
    pIVar4 = (trees->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((trees->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
        super__Vector_impl_data._M_finish != pIVar4) {
      lVar8 = 0x48;
      lVar6 = 0x38;
      uVar7 = 0;
      do {
        pIVar2 = (imputer_tree->super__Vector_base<ImputeNode,_std::allocator<ImputeNode>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        if (*(long *)((long)&pIVar4->col_type + lVar6) == 0) {
          pvVar1 = (vector<double,_std::allocator<double>_> *)
                   ((long)&(pIVar2->num_sum).super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl + lVar8);
          pdVar3 = *(pointer *)
                    ((long)&(pIVar2->num_sum).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl + lVar8);
          if (*(pointer *)
               ((long)&(pIVar2->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl
               + lVar8 + 8) != pdVar3) {
            (pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish = pdVar3;
          }
          if (*(pointer *)
               ((long)&(pIVar2->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl
               + lVar8 + 0x10) != pdVar3) {
            std::__shrink_to_fit_aux<std::vector<double,_std::allocator<double>_>,_true>::_S_do_it
                      (pvVar1);
          }
        }
        else {
          shrink_impute_node((ImputeNode *)((long)pIVar2 + lVar8 + -0x48));
        }
        uVar7 = uVar7 + 1;
        pIVar4 = (trees->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar8 = lVar8 + 0x68;
        lVar6 = lVar6 + 0x70;
      } while (uVar7 < (ulong)(((long)(trees->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar4 >> 4
                               ) * 0x6db6db6db6db6db7));
    }
  }
  if ((imputer_tree->super__Vector_base<ImputeNode,_std::allocator<ImputeNode>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage ==
      (imputer_tree->super__Vector_base<ImputeNode,_std::allocator<ImputeNode>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    return;
  }
  std::__shrink_to_fit_aux<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_true>::_S_do_it
            (imputer_tree);
  return;
}

Assistant:

void drop_nonterminal_imp_node(std::vector<ImputeNode>  &imputer_tree,
                               std::vector<IsoTree>     *trees,
                               std::vector<IsoHPlane>   *hplanes)
{
    if (trees != NULL)
    {
        for (size_t tr = 0; tr < trees->size(); tr++)
        {
            if ((*trees)[tr].tree_left != 0)
            {
                shrink_impute_node(imputer_tree[tr]);
            }

            else
            {
                /* cat_weight is not needed for anything else */
                imputer_tree[tr].cat_weight.clear();
                imputer_tree[tr].cat_weight.shrink_to_fit();
            }
        }
    }

    else
    {
        for (size_t tr = 0; tr < hplanes->size(); tr++)
        {
            if ((*hplanes)[tr].hplane_left != 0)
            {
                shrink_impute_node(imputer_tree[tr]);
            }

            else
            {
                /* cat_weight is not needed for anything else */
                imputer_tree[tr].cat_weight.clear();
                imputer_tree[tr].cat_weight.shrink_to_fit();
            }
        }
    }

    imputer_tree.shrink_to_fit();
}